

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O2

void __thiscall mailManager::~mailManager(mailManager *this)

{
  mailSocket::sendData(this->socket,"quit\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  std::__cxx11::_List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>::_M_clear
            (&(this->list).super__List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->map)._M_t);
  return;
}

Assistant:

mailManager::~mailManager() {
    socket->sendData("quit\r\n");
    socket->recvData(recvData, BUF_SIZE);
}